

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline(ConvolutionDepthWise_x86 *this,Option *opt)

{
  int iVar1;
  _func_int *p_Var2;
  pointer ppLVar3;
  pointer ppLVar4;
  ulong uVar5;
  Layer *pLVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int i;
  long lVar10;
  int iVar11;
  float f;
  Mat local_b30;
  int local_aec;
  Mat *local_ae8;
  Option *local_ae0;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_ad8;
  long local_ad0;
  undefined1 *local_ac8;
  size_t local_ac0;
  Mat weight_data_g;
  Mat bias_data_g;
  Mat weights [4];
  ParamDict pd;
  
  local_ae0 = opt;
  switch(*(undefined4 *)(&this->field_0xf8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
  case 1:
    pLVar6 = create_layer(0x1a);
    this->activation = pLVar6;
    ParamDict::ParamDict(&pd);
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 2:
    pLVar6 = create_layer(0x1a);
    this->activation = pLVar6;
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           (&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 3:
    pLVar6 = create_layer(0x36);
    this->activation = pLVar6;
    ParamDict::ParamDict(&pd);
    p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
    if ((&this->field_0x244)[(long)p_Var2] == '\x01') {
      ParamDict::set(&pd,0,**(float **)(&this->field_0x100 + (long)p_Var2) *
                           *(float *)(&this->field_0x240 + (long)p_Var2));
      f = *(float *)(&this->field_0x240 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) *
          *(float *)(*(long *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                    + 4);
    }
    else {
      ParamDict::set(&pd,0,**(float **)(&this->field_0x100 + (long)p_Var2));
      f = *(float *)(*(long *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                    + 4);
    }
    ParamDict::set(&pd,1,f);
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 4:
    pLVar6 = create_layer(0x1e);
    this->activation = pLVar6;
    ParamDict::ParamDict(&pd);
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  default:
    goto switchD_00148662_default;
  }
  ParamDict::~ParamDict(&pd);
switchD_00148662_default:
  pLVar6 = this->activation;
  if (pLVar6 != (Layer *)0x0) {
    (*pLVar6->_vptr_Layer[4])(pLVar6,local_ae0);
  }
  p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar1 = *(int *)(&this->field_0xb8 + (long)p_Var2);
  iVar9 = *(int *)(&this->field_0xc0 + (long)p_Var2) * *(int *)(&this->field_0xbc + (long)p_Var2);
  iVar8 = *(int *)(&this->field_0xf0 + (long)p_Var2);
  uVar5 = (long)*(int *)(&this->field_0xec + (long)p_Var2) / (long)iVar8;
  uVar5 = (long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / (long)iVar9;
  local_ad8 = &this->group_ops;
  lVar10 = 0;
  while( true ) {
    ppLVar3 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar4 - (long)ppLVar3) >> 3) <= lVar10) break;
    if (ppLVar3[lVar10] != (Layer *)0x0) {
      (*ppLVar3[lVar10]->_vptr_Layer[1])();
    }
    lVar10 = lVar10 + 1;
  }
  iVar8 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
               (long)(iVar1 / iVar8)) * iVar8;
  if (ppLVar4 != ppLVar3) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar3;
  }
  p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar1 = *(int *)(&this->field_0xf0 + (long)p_Var2);
  iVar11 = *(int *)(&this->field_0xb8 + (long)p_Var2);
  if (((((iVar8 != iVar1) || (iVar8 != iVar11)) ||
       (iVar11 = iVar8, *(int *)(&this->field_0xbc + (long)p_Var2) != 3)) ||
      (*(int *)(&this->field_0xc0 + (long)p_Var2) != 3)) ||
     ((((*(int *)(&this->field_0xc4 + (long)p_Var2) != 1 ||
        (*(int *)(&this->field_0xc8 + (long)p_Var2) != 1)) ||
       ((*(int *)(&this->field_0xcc + (long)p_Var2) != 1 ||
        (*(int *)(&this->field_0xd0 + (long)p_Var2) != 1)))) &&
      (((*(int *)(&this->field_0xc4 + (long)p_Var2) != 1 ||
        (*(int *)(&this->field_0xc8 + (long)p_Var2) != 1)) ||
       ((*(int *)(&this->field_0xcc + (long)p_Var2) != 2 ||
        (*(int *)(&this->field_0xd0 + (long)p_Var2) != 2)))))))) {
    iVar11 = iVar11 / iVar1;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_ad8,(long)iVar1);
    local_ac8 = &this->field_0x100;
    local_aec = (iVar8 / iVar1) * iVar9 * iVar11;
    local_ac0 = (size_t)local_aec;
    local_ad0 = (long)iVar11;
    local_ae8 = weights + 2;
    lVar10 = 0;
    while( true ) {
      p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
      if (*(int *)(&this->field_0xf0 + (long)p_Var2) <= lVar10) break;
      weight_data_g.elemsize = *(size_t *)(&this->field_0x150 + (long)p_Var2);
      weight_data_g.data =
           (void *)(lVar10 * local_ac0 * weight_data_g.elemsize +
                   *(long *)(&this->field_0x140 + (long)p_Var2));
      weight_data_g.elempack = *(int *)(&this->field_0x158 + (long)p_Var2);
      weight_data_g.allocator = *(Allocator **)(&this->field_0x160 + (long)p_Var2);
      weight_data_g.refcount = (int *)0x0;
      weight_data_g.dims = 1;
      weight_data_g.w = (int)local_ac0;
      weight_data_g.h = 1;
      weight_data_g.c = 1;
      weight_data_g.cstep = local_ac0;
      bias_data_g.elemsize._0_4_ = 0;
      bias_data_g._20_8_ = 0;
      bias_data_g.data = (void *)0x0;
      bias_data_g.refcount._0_4_ = 0;
      bias_data_g.refcount._4_4_ = 0;
      bias_data_g.h = 0;
      bias_data_g.c = 0;
      bias_data_g.cstep = 0;
      bias_data_g.allocator = (Allocator *)0x0;
      bias_data_g.dims = 0;
      bias_data_g.w = 0;
      p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
      if (*(int *)(&this->field_0xe8 + (long)p_Var2) != 0) {
        pd.params[0].v.refcount = *(int **)(&this->field_0x190 + (long)p_Var2);
        pd.params[0]._0_8_ =
             lVar10 * local_ad0 * (long)pd.params[0].v.refcount +
             *(long *)(&this->field_0x180 + (long)p_Var2);
        pd.params[0].v.elemsize._0_4_ = *(undefined4 *)(&this->field_0x198 + (long)p_Var2);
        pd.params[0].v._24_8_ = *(undefined8 *)(&this->field_0x1a0 + (long)p_Var2);
        pd.params[0].v.data = (void *)0x0;
        pd.params[0].v.allocator._0_4_ = 1;
        pd.params[0].v.dims = 1;
        pd.params[0].v.w = 1;
        pd.params[0].v.h = (undefined4)local_ad0;
        pd.params[0].v.c = local_ad0._4_4_;
        pd.params[0].v.allocator._4_4_ = iVar11;
        Mat::operator=(&bias_data_g,(Mat *)&pd);
        Mat::~Mat((Mat *)&pd);
      }
      pLVar6 = create_layer(6);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,iVar11);
      ParamDict::set(&pd,1,*(int *)(&this->field_0xbc +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&pd,0xb,*(int *)(&this->field_0xc0 +
                                     (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&pd,2,*(int *)(&this->field_0xc4 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&pd,0xc,*(int *)(&this->field_0xc8 +
                                     (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&pd,3,*(int *)(&this->field_0xcc +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&pd,0xd,*(int *)(&this->field_0xd0 +
                                     (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&pd,4,0);
      ParamDict::set(&pd,0xe,0);
      ParamDict::set(&pd,5,*(int *)(&this->field_0xe8 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&pd,6,local_aec);
      ParamDict::set(&pd,8,*(int *)(&this->field_0xf4 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&pd,9,*(int *)(&this->field_0xf8 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&pd,10,(Mat *)(local_ac8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      (*pLVar6->_vptr_Layer[2])(pLVar6,(Mat *)&pd);
      if (*(int *)(&this->field_0xe8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) == 0) {
        lVar7 = 0x20;
        do {
          *(undefined8 *)((long)weights + lVar7 + -0x14) = 0;
          *(undefined8 *)((long)weights + lVar7 + -0xc) = 0;
          *(undefined8 *)((long)weights + lVar7 + -0x20) = 0;
          *(undefined8 *)((long)weights + lVar7 + -0x18) = 0;
          *(undefined8 *)((long)&weights[0].data + lVar7) = 0;
          *(undefined8 *)((long)&weights[0].refcount + lVar7) = 0;
          *(undefined8 *)((long)&weights[0].elemsize + lVar7) = 0;
          *(undefined8 *)((long)&weights[0].elempack + lVar7) = 0;
          lVar7 = lVar7 + 0x40;
        } while (lVar7 != 0xe0);
        Mat::operator=(weights,&weight_data_g);
        p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
        if (*(int *)(&this->field_0xf4 + (long)p_Var2) != 0) {
          local_b30.elemsize = *(size_t *)(&this->field_0x1d0 + (long)p_Var2);
          local_b30.data =
               (void *)(local_b30.elemsize * lVar10 + *(long *)(&this->field_0x1c0 + (long)p_Var2));
          local_b30.elempack = *(int *)(&this->field_0x1d8 + (long)p_Var2);
          local_b30.allocator = *(Allocator **)(&this->field_0x1e0 + (long)p_Var2);
          local_b30.refcount = (int *)0x0;
          local_b30.dims = 1;
          local_b30.w = 1;
          local_b30.h = 1;
          local_b30.c = 1;
          local_b30.cstep = 1;
          Mat::operator=(weights + 1,&local_b30);
          Mat::~Mat(&local_b30);
          p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
          local_b30.elemsize = *(size_t *)(&this->field_0x210 + (long)p_Var2);
          local_b30.data =
               (void *)(local_b30.elemsize * lVar10 + *(long *)(&this->field_0x200 + (long)p_Var2));
          local_b30.elempack = *(int *)(&this->field_0x218 + (long)p_Var2);
          local_b30.allocator = *(Allocator **)(&this->field_0x220 + (long)p_Var2);
          local_b30.refcount = (int *)0x0;
          local_b30.dims = 1;
          local_b30.w = 1;
          local_b30.h = 1;
          local_b30.c = 1;
          local_b30.cstep = 1;
          Mat::operator=(local_ae8,&local_b30);
          Mat::~Mat(&local_b30);
        }
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_b30,weights);
        (*pLVar6->_vptr_Layer[3])(pLVar6,&local_b30);
        ModelBin::~ModelBin((ModelBin *)&local_b30);
        lVar7 = 0x80;
        do {
          Mat::~Mat((Mat *)((long)&weights[0].data + lVar7));
          lVar7 = lVar7 + -0x40;
        } while (lVar7 != -0x40);
      }
      else {
        lVar7 = 0;
        do {
          *(undefined8 *)((long)&weights[0].refcount + lVar7 + 4) = 0;
          *(undefined8 *)((long)&weights[0].elemsize + lVar7 + 4) = 0;
          *(undefined8 *)((long)&weights[0].data + lVar7) = 0;
          *(undefined8 *)((long)&weights[0].refcount + lVar7) = 0;
          *(undefined8 *)((long)&weights[0].allocator + lVar7) = 0;
          *(undefined8 *)((long)&weights[0].dims + lVar7) = 0;
          *(undefined8 *)((long)&weights[0].h + lVar7) = 0;
          *(undefined8 *)((long)&weights[0].cstep + lVar7) = 0;
          lVar7 = lVar7 + 0x40;
        } while (lVar7 != 0x100);
        Mat::operator=(weights,&weight_data_g);
        Mat::operator=(weights + 1,&bias_data_g);
        p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
        if (*(int *)(&this->field_0xf4 + (long)p_Var2) != 0) {
          local_b30.elemsize = *(size_t *)(&this->field_0x1d0 + (long)p_Var2);
          local_b30.data =
               (void *)(local_b30.elemsize * lVar10 + *(long *)(&this->field_0x1c0 + (long)p_Var2));
          local_b30.elempack = *(int *)(&this->field_0x1d8 + (long)p_Var2);
          local_b30.allocator = *(Allocator **)(&this->field_0x1e0 + (long)p_Var2);
          local_b30.refcount = (int *)0x0;
          local_b30.dims = 1;
          local_b30.w = 1;
          local_b30.h = 1;
          local_b30.c = 1;
          local_b30.cstep = 1;
          Mat::operator=(local_ae8,&local_b30);
          Mat::~Mat(&local_b30);
          p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
          local_b30.elemsize = *(size_t *)(&this->field_0x210 + (long)p_Var2);
          local_b30.data =
               (void *)(local_b30.elemsize * lVar10 + *(long *)(&this->field_0x200 + (long)p_Var2));
          local_b30.elempack = *(int *)(&this->field_0x218 + (long)p_Var2);
          local_b30.allocator = *(Allocator **)(&this->field_0x220 + (long)p_Var2);
          local_b30.refcount = (int *)0x0;
          local_b30.dims = 1;
          local_b30.w = 1;
          local_b30.h = 1;
          local_b30.c = 1;
          local_b30.cstep = 1;
          Mat::operator=(weights + 3,&local_b30);
          Mat::~Mat(&local_b30);
        }
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_b30,weights);
        (*pLVar6->_vptr_Layer[3])(pLVar6,&local_b30);
        ModelBin::~ModelBin((ModelBin *)&local_b30);
        lVar7 = 0xc0;
        do {
          Mat::~Mat((Mat *)((long)&weights[0].data + lVar7));
          lVar7 = lVar7 + -0x40;
        } while (lVar7 != -0x40);
      }
      (*pLVar6->_vptr_Layer[4])(pLVar6,local_ae0);
      (local_ad8->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar10] = pLVar6;
      ParamDict::~ParamDict(&pd);
      Mat::~Mat(&bias_data_g);
      Mat::~Mat(&weight_data_g);
      lVar10 = lVar10 + 1;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        if (use_int8_requantize)
        {
            pd.set(0, activation_params[0] * top_blob_int8_scale);// min
            pd.set(1, activation_params[1] * top_blob_int8_scale);// max
        }
        else
        {
            pd.set(0, activation_params[0]);// min
            pd.set(1, activation_params[1]);// max
        }

        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();      

    if (channels == group && group == num_output)
    {
        // depth-wise specific
        // special path for both int8 and fp32
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            return 0;
        }
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);     

    for (int g=0; g<group; g++)
    {  
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g);// weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales.range(g, 1);
                weights[3] = bottom_blob_int8_scales.range(g, 1);     
            }

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[3];
            weights[0] = weight_data_g;

            if (int8_scale_term)
            {
                weights[1] = weight_data_int8_scales.range(g, 1);
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

//         op->use_int8_requantize = use_int8_requantize; FIXME

        group_ops[g] = op;
    }      

    return 0;
}